

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::
Table<kj::HashMap<kj::String,_int>::Entry,_kj::HashIndex<kj::HashMap<kj::String,_int>::Callbacks>_>
::eraseImpl(Table<kj::HashMap<kj::String,_int>::Entry,_kj::HashIndex<kj::HashMap<kj::String,_int>::Callbacks>_>
            *this,size_t pos)

{
  size_t oldPos;
  undefined8 *puVar1;
  StringPtr *pSVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table;
  ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table_00;
  
  pSVar2 = *(StringPtr **)this;
  table.size_ = *(long *)(this + 8) - (long)pSVar2 >> 5;
  table.ptr = pSVar2;
  HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
  erase<kj::HashMap<kj::String,int>::Entry,kj::String&>
            ((HashIndex<kj::HashMap<kj::String,int>::Callbacks> *)(this + 0x20),table,pos,
             (String *)(pSVar2 + pos * 2));
  pSVar2 = *(StringPtr **)this;
  table_00.size_ = *(long *)(this + 8) - (long)pSVar2 >> 5;
  oldPos = table_00.size_ - 1;
  if (oldPos != pos) {
    table_00.ptr = pSVar2;
    HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
    move<kj::HashMap<kj::String,int>::Entry,kj::String&>
              ((HashIndex<kj::HashMap<kj::String,int>::Callbacks> *)(this + 0x20),table_00,oldPos,
               pos,(String *)(pSVar2 + oldPos * 2));
    lVar3 = *(long *)this;
    puVar5 = (undefined8 *)(oldPos * 0x20 + lVar3);
    puVar1 = (undefined8 *)(lVar3 + pos * 0x20);
    lVar3 = *(long *)(lVar3 + pos * 0x20);
    if (lVar3 != 0) {
      uVar4 = puVar1[1];
      *puVar1 = 0;
      puVar1[1] = 0;
      (*(code *)**(undefined8 **)puVar1[2])((undefined8 *)puVar1[2],lVar3,1,uVar4,uVar4,0);
    }
    *puVar1 = *puVar5;
    puVar1[1] = puVar5[1];
    puVar1[2] = puVar5[2];
    *puVar5 = 0;
    puVar5[1] = 0;
    *(undefined4 *)(puVar1 + 3) = *(undefined4 *)(puVar5 + 3);
  }
  ArrayBuilder<kj::HashMap<kj::String,_int>::Entry>::removeLast
            ((ArrayBuilder<kj::HashMap<kj::String,_int>::Entry> *)this);
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}